

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

void chrono::utils::AddTriangleGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,ChVector<double> *vertA
               ,ChVector<double> *vertB,ChVector<double> *vertC,string *name,ChVector<double> *pos,
               ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  _Atomic_word *this;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  _func_int **pp_Var12;
  char cVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double *pdVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  ChTriangleMeshShape *this_01;
  ChBody *model;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  element_type *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_158;
  undefined1 local_148 [24];
  undefined1 auStack_130 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  element_type *local_118;
  ChSystem *pCStack_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  pointer local_f8;
  ChVisualModel *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  ChFrame<double> local_e0;
  ChQuaternion<double> local_58;
  
  local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  local_f8 = (pointer)material;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x110);
  this = &this_00[1]._M_use_count;
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b3ebb8;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChTriangleMeshConnected_00b3eaa8;
  this_00[9]._M_use_count = 0;
  this_00[9]._M_weak_count = 0;
  this_00[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[10]._M_use_count = 0;
  this_00[10]._M_weak_count = 0;
  this_00[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xb]._M_use_count = 0;
  this_00[0xb]._M_weak_count = 0;
  this_00[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xc]._M_use_count = 0;
  this_00[0xc]._M_weak_count = 0;
  this_00[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[2]._M_use_count = 0;
  this_00[2]._M_weak_count = 0;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[3]._M_use_count = 0;
  this_00[3]._M_weak_count = 0;
  this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[4]._M_use_count = 0;
  this_00[4]._M_weak_count = 0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[5]._M_use_count = 0;
  this_00[5]._M_weak_count = 0;
  this_00[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[6]._M_use_count = 0;
  this_00[6]._M_weak_count = 0;
  this_00[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[7]._M_use_count = 0;
  this_00[7]._M_weak_count = 0;
  this_00[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[8]._M_use_count = 0;
  this_00[8]._M_weak_count = 0;
  this_00[9]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xb]._M_use_count = 0;
  this_00[0xb]._M_weak_count = 0;
  this_00[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xc]._M_use_count = 0;
  this_00[0xc]._M_weak_count = 0;
  this_00[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xd]._M_use_count = 0;
  this_00[0xd]._M_weak_count = 0;
  this_00[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xe]._M_use_count = 0;
  this_00[0xe]._M_weak_count = 0;
  this_00[0xf]._vptr__Sp_counted_base = (_func_int **)(this_00 + 0x10);
  this_00[0xf]._M_use_count = 0;
  this_00[0xf]._M_weak_count = 0;
  *(undefined1 *)&this_00[0x10]._vptr__Sp_counted_base = 0;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)this,
             vertA);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)this,
             vertB);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)this,
             vertC);
  local_e0._vptr_ChFrame = (_func_int **)0x100000000;
  local_e0.coord.pos.m_data[0] = (double)CONCAT44(local_e0.coord.pos.m_data[0]._4_4_,2);
  std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
  emplace_back<chrono::ChVector<int>>
            ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
             &this_00[7]._M_use_count,(ChVector<int> *)&local_e0);
  lVar16 = (long)this_00[2]._vptr__Sp_counted_base - *(long *)&this_00[1]._M_use_count;
  if (lVar16 != 0) {
    auVar17 = ZEXT816(0xbff0000000000000);
    auVar18 = ZEXT816(0x4000000000000000);
    lVar16 = (lVar16 >> 3) * -0x5555555555555555;
    lVar16 = lVar16 + (ulong)(lVar16 == 0);
    pdVar14 = (double *)(*(long *)&this_00[1]._M_use_count + 0x10);
    do {
      dVar1 = rot->m_data[0];
      dVar2 = rot->m_data[2];
      dVar3 = rot->m_data[1];
      dVar4 = rot->m_data[3];
      dVar5 = pdVar14[-1];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = pdVar14[-2];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *pdVar14;
      dVar9 = dVar1 * dVar1;
      dVar10 = dVar3 * dVar2 - dVar4 * dVar1;
      dVar8 = dVar3 * dVar2 + dVar4 * dVar1;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar9 + dVar2 * dVar2;
      auVar24 = vfmadd213sd_fma(auVar26,auVar18,auVar17);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar9 + dVar3 * dVar3;
      auVar20 = vfmadd213sd_fma(auVar23,auVar18,auVar17);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar5 * (dVar10 + dVar10);
      auVar20 = vfmadd231sd_fma(auVar28,auVar29,auVar20);
      dVar10 = dVar1 * dVar2 + dVar4 * dVar3;
      dVar11 = dVar4 * dVar3 - dVar1 * dVar2;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar8 + dVar8;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar5 * auVar24._0_8_;
      auVar19 = vfmadd231sd_fma(auVar27,auVar29,auVar19);
      dVar8 = dVar4 * dVar2 - dVar1 * dVar3;
      dVar2 = dVar1 * dVar3 + dVar4 * dVar2;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar10 + dVar10;
      auVar24 = vfmadd213sd_fma(auVar24,auVar30,auVar20);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar8 + dVar8;
      auVar20 = vfmadd213sd_fma(auVar20,auVar30,auVar19);
      dVar1 = pos->m_data[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar11 + dVar11;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar5 * (dVar2 + dVar2);
      auVar21 = vfmadd231sd_fma(auVar25,auVar29,auVar21);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar4 * dVar4 + dVar9;
      auVar19 = vfmadd213sd_fma(auVar22,auVar18,auVar17);
      auVar19 = vfmadd213sd_fma(auVar19,auVar30,auVar21);
      dVar2 = pos->m_data[2];
      pdVar14[-2] = auVar24._0_8_ + pos->m_data[0];
      pdVar14[-1] = auVar20._0_8_ + dVar1;
      *pdVar14 = auVar19._0_8_ + dVar2;
      pdVar14 = pdVar14 + 3;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  cVar13 = __libc_single_threaded;
  peVar6 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var15 = (body->collision_model).
            super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
      UNLOCK();
      cVar13 = __libc_single_threaded;
    }
    else {
      p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
    }
  }
  local_118 = (local_f8->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCStack_110 = (ChSystem *)
                (local_f8->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  p_Var7 = (local_f8->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00913009:
    if (cVar13 == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      goto LAB_00913025;
    }
  }
  else {
    if (cVar13 == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
      cVar13 = __libc_single_threaded;
      goto LAB_00913009;
    }
    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
  }
  this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_00913025:
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 0.0;
  local_e0.coord.rot.m_data[1] = 0.0;
  local_e0.coord.rot.m_data[2] = 0.0;
  local_e0.coord.rot.m_data[3] = 0.0;
  local_e0.coord.pos.m_data[0] = 0.0;
  local_e0.coord.pos.m_data[1] = 0.0;
  local_e0.coord.pos.m_data[2] = 0.0;
  local_e0._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_e0.coord.rot.m_data[0] = 1.0;
  local_e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_168 = (element_type *)(this_00 + 1);
  local_160 = this_00;
  (*peVar6->_vptr_ChCollisionModel[0x10])(peVar6,&local_118,&local_168,0,0,&local_58,&local_e0);
  if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
  }
  if (pCStack_110 != (ChSystem *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_110);
  }
  if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
  }
  if (visualization) {
    model = body;
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    pp_Var12 = local_e0._vptr_ChFrame;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0.coord.pos.m_data[0]);
    }
    if (pp_Var12 == (_func_int **)0x0) {
      p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
      p_Var15->_M_use_count = 1;
      p_Var15->_M_weak_count = 1;
      local_148._0_8_ = p_Var15 + 1;
      p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
      p_Var15[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var15[1]._M_use_count = 0;
      p_Var15[1]._M_weak_count = 0;
      p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var15[2]._M_use_count = 0;
      p_Var15[2]._M_weak_count = 0;
      p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var15[2]._M_use_count = 0;
      p_Var15[2]._M_weak_count = 0;
      p_Var15[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var15[3]._M_use_count = 0;
      p_Var15[3]._M_weak_count = 0;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var15->_M_use_count = 2;
      }
      model = (ChBody *)local_148;
      local_148._8_8_ = p_Var15;
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    }
    this_01 = (ChTriangleMeshShape *)
              ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)model);
    ChTriangleMeshShape::ChTriangleMeshShape(this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
              (&_Stack_170,this_01);
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    local_158.
    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)(this_00 + 1);
    local_158.
    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    ChTriangleMeshShape::SetMesh(this_01,&local_158,true);
    if (local_158.
        super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::__cxx11::string::_M_assign((string *)&this_01->name);
    auStack_130._8_8_ =
         (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    p_Stack_120 = (vis_material->
                  super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
    p_Var15 = (vis_material->
              super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
      }
    }
    ChVisualShape::AddMaterial
              ((ChVisualShape *)this_01,(shared_ptr<chrono::ChVisualMaterial> *)(auStack_130 + 8));
    if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
    }
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    auStack_130._0_8_ = _Stack_170._M_pi;
    if (_Stack_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_170._M_pi)->_M_use_count = (_Stack_170._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_170._M_pi)->_M_use_count = (_Stack_170._M_pi)->_M_use_count + 1;
      }
    }
    local_58.m_data[0] = 1.0;
    local_58.m_data[1] = 0.0;
    local_58.m_data[2] = 0.0;
    local_58.m_data[3] = 0.0;
    local_e0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
    local_e0.coord.pos.m_data[0] = 0.0;
    local_e0.coord.pos.m_data[1] = 0.0;
    local_e0.coord.pos.m_data[2] = 0.0;
    local_e0.coord.rot.m_data[0] = 1.0;
    local_e0.coord.rot.m_data[1] = 0.0;
    local_e0.coord.rot.m_data[2] = 0.0;
    local_e0.coord.rot.m_data[3] = 0.0;
    local_148._16_8_ = this_01;
    ChMatrix33<double>::ChMatrix33(&local_e0.Amatrix,&local_58);
    ChVisualModel::AddShape
              (local_f0,(shared_ptr<chrono::ChVisualShape> *)(local_148 + 0x10),&local_e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_130._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_130._0_8_);
    }
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    if (_Stack_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_170._M_pi);
    }
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void AddTriangleGeometry(ChBody* body,
                         std::shared_ptr<ChMaterialSurface> material,
                         const ChVector<>& vertA,
                         const ChVector<>& vertB,
                         const ChVector<>& vertC,
                         const std::string& name,
                         const ChVector<>& pos,
                         const ChQuaternion<>& rot,
                         bool visualization,
                         std::shared_ptr<ChVisualMaterial> vis_material) {
    auto trimesh = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
    trimesh->m_vertices.clear();
    trimesh->m_face_v_indices.clear();
    trimesh->m_vertices.push_back(vertA);
    trimesh->m_vertices.push_back(vertB);
    trimesh->m_vertices.push_back(vertC);
    trimesh->m_face_v_indices.push_back(ChVector<int>(0, 1, 2));

    for (int i = 0; i < trimesh->m_vertices.size(); i++)
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);

    body->GetCollisionModel()->AddTriangleMesh(material, trimesh, false, false);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }
}